

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZX8081.cpp
# Opt level: O1

void __thiscall
Sinclair::ZX8081::ConcreteMachine<false>::set_options
          (ConcreteMachine<false> *this,
          unique_ptr<Reflection::Struct,_std::default_delete<Reflection::Struct>_> *str)

{
  bool bVar1;
  long lVar2;
  
  lVar2 = __dynamic_cast((str->_M_t).
                         super___uniq_ptr_impl<Reflection::Struct,_std::default_delete<Reflection::Struct>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Reflection::Struct_*,_std::default_delete<Reflection::Struct>_>
                         .super__Head_base<0UL,_Reflection::Struct_*,_false>._M_head_impl,
                         &Reflection::Struct::typeinfo,&ZX8081::Machine::Options::typeinfo,0);
  bVar1 = *(bool *)(lVar2 + 9);
  this->use_automatic_tape_motor_control_ = bVar1;
  if (bVar1 == false) {
    Storage::Tape::BinaryTapePlayer::set_motor_control
              (&(this->tape_player_).super_BinaryTapePlayer,false);
  }
  bVar1 = *(bool *)(lVar2 + 8);
  this->allow_fast_tape_hack_ = bVar1;
  if (bVar1 == true) {
    bVar1 = Storage::Tape::TapePlayer::has_tape((TapePlayer *)&this->tape_player_);
  }
  else {
    bVar1 = false;
  }
  this->use_fast_tape_hack_ = bVar1;
  return;
}

Assistant:

void set_options(const std::unique_ptr<Reflection::Struct> &str) {
			const auto options = dynamic_cast<Options *>(str.get());
			set_use_automatic_tape_motor_control(options->automatic_tape_motor_control);
			allow_fast_tape_hack_ = options->quickload;
			set_use_fast_tape();
		}